

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Type __thiscall capnp::StructSchema::Field::getType(Field *this)

{
  Reader proto_00;
  Which WVar1;
  uint64_t id;
  Reader local_f8;
  Schema local_c8;
  Schema local_c0;
  Reader local_b8;
  Reader local_88;
  uint local_54;
  undefined1 local_50 [4];
  uint location;
  Reader proto;
  Field *this_local;
  
  proto._reader._40_8_ = this;
  getProto((Reader *)local_50,this);
  local_54 = capnp::_::RawBrandedSchema::makeDepLocation(FIELD,this->index);
  WVar1 = capnp::schema::Field::Reader::which((Reader *)local_50);
  if (WVar1 == SLOT) {
    capnp::schema::Field::Reader::getSlot(&local_b8,(Reader *)local_50);
    capnp::schema::Field::Slot::Reader::getType(&local_88,&local_b8);
    proto_00._reader.capTable = local_88._reader.capTable;
    proto_00._reader.segment = local_88._reader.segment;
    proto_00._reader.data = local_88._reader.data;
    proto_00._reader.pointers = local_88._reader.pointers;
    proto_00._reader.dataSize = local_88._reader.dataSize;
    proto_00._reader.pointerCount = local_88._reader.pointerCount;
    proto_00._reader._38_2_ = local_88._reader._38_2_;
    proto_00._reader.nestingLimit = local_88._reader.nestingLimit;
    proto_00._reader._44_4_ = local_88._reader._44_4_;
    _this_local = Schema::interpretType((Schema *)this,proto_00,local_54);
  }
  else {
    if (WVar1 != GROUP) {
      kj::_::unreachable();
    }
    capnp::schema::Field::Reader::getGroup(&local_f8,(Reader *)local_50);
    id = capnp::schema::Field::Group::Reader::getTypeId(&local_f8);
    local_c8 = Schema::getDependency((Schema *)this,id,local_54);
    local_c0.raw = (RawBrandedSchema *)Schema::asStruct(&local_c8);
    capnp::Type::Type((Type *)&this_local,(StructSchema)local_c0.raw);
  }
  return _this_local;
}

Assistant:

Type StructSchema::Field::getType() const {
  auto proto = getProto();
  uint location = _::RawBrandedSchema::makeDepLocation(_::RawBrandedSchema::DepKind::FIELD, index);

  switch (proto.which()) {
    case schema::Field::SLOT:
      return parent.interpretType(proto.getSlot().getType(), location);

    case schema::Field::GROUP:
      return parent.getDependency(proto.getGroup().getTypeId(), location).asStruct();
  }
  KJ_UNREACHABLE;
}